

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

Matrix __thiscall maths::Matrix::solve(Matrix *this,Matrix *A,Matrix *b)

{
  int iVar1;
  double **ppdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  domain_error *this_00;
  long lVar7;
  uint uVar8;
  ulong uVar10;
  int iVar11;
  int j;
  long lVar12;
  int k;
  long lVar13;
  double dVar14;
  Matrix MVar15;
  ulong uVar9;
  
  lVar6 = 1;
  lVar7 = 0;
  while( true ) {
    iVar1 = A->rows_;
    if (iVar1 <= lVar7) {
      Matrix(this,b->rows_,1);
      iVar1 = this->rows_;
      dVar14 = *b->p[(long)iVar1 + -1] / A->p[(long)iVar1 + -1][(long)iVar1 + -1];
      ppdVar2 = this->p;
      *ppdVar2[(long)iVar1 + -1] = (double)(~-(ulong)(ABS(dVar14) < 1e-10) & (ulong)dVar14);
      for (uVar8 = iVar1 - 2; uVar9 = (ulong)uVar8, -1 < (int)uVar8; uVar8 = uVar8 - 1) {
        iVar11 = 0;
        uVar10 = uVar9;
        while( true ) {
          uVar10 = uVar10 + 1;
          if (iVar1 <= (int)uVar10) break;
          iVar11 = (int)(A->p[uVar9][uVar10] * *ppdVar2[uVar10] + (double)iVar11);
        }
        dVar14 = (*b->p[uVar9] - (double)iVar11) / A->p[uVar9][uVar9];
        *ppdVar2[uVar9] = (double)(~-(ulong)(ABS(dVar14) < 1e-10) & (ulong)dVar14);
      }
      MVar15.p._0_4_ = uVar8;
      MVar15._0_8_ = this;
      MVar15.p._4_4_ = 0;
      return MVar15;
    }
    ppdVar2 = A->p;
    pdVar3 = ppdVar2[lVar7];
    lVar12 = lVar6;
    if ((pdVar3[lVar7] == 0.0) && (!NAN(pdVar3[lVar7]))) break;
    for (; lVar13 = lVar6, (int)lVar12 < iVar1; lVar12 = lVar12 + 1) {
      for (; (int)lVar13 < A->cols_; lVar13 = lVar13 + 1) {
        pdVar4 = ppdVar2[lVar12];
        dVar14 = pdVar4[lVar13] - (pdVar4[lVar7] / pdVar3[lVar7]) * pdVar3[lVar13];
        pdVar4[lVar13] = (double)(~-(ulong)(ABS(dVar14) < 1e-10) & (ulong)dVar14);
      }
      pdVar4 = ppdVar2[lVar12];
      pdVar5 = b->p[lVar12];
      *pdVar5 = *pdVar5 - (pdVar4[lVar7] / pdVar3[lVar7]) * *b->p[lVar7];
      if (ABS(*pdVar4) < 1e-10) {
        *pdVar4 = 0.0;
      }
      pdVar4[lVar7] = 0.0;
    }
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 1;
  }
  this_00 = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error
            (this_00,
             "Error: the coefficient matrix has 0 as a pivot. Please fix the input and try again.");
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

Matrix Matrix::solve(Matrix A, Matrix b)
{
    // Gaussian elimination
    for (int i = 0; i < A.rows_; ++i) {
        if (A.p[i][i] == 0) {
            // pivot 0 - throw error
            throw domain_error("Error: the coefficient matrix has 0 as a pivot. Please fix the input and try again.");
        }
        for (int j = i + 1; j < A.rows_; ++j) {
            for (int k = i + 1; k < A.cols_; ++k) {
                A.p[j][k] -= A.p[i][k] * (A.p[j][i] / A.p[i][i]);
                if (A.p[j][k] < EPS && A.p[j][k] > -1*EPS)
                    A.p[j][k] = 0;
            }
            b.p[j][0] -= b.p[i][0] * (A.p[j][i] / A.p[i][i]);
            if (A.p[j][0] < EPS && A.p[j][0] > -1*EPS)
                A.p[j][0] = 0;
            A.p[j][i] = 0;
        }
    }

    // Back substitution
    Matrix x(b.rows_, 1);
    x.p[x.rows_ - 1][0] = b.p[x.rows_ - 1][0] / A.p[x.rows_ - 1][x.rows_ - 1];
    if (x.p[x.rows_ - 1][0] < EPS && x.p[x.rows_ - 1][0] > -1*EPS)
        x.p[x.rows_ - 1][0] = 0;
    for (int i = x.rows_ - 2; i >= 0; --i) {
        int sum = 0;
        for (int j = i + 1; j < x.rows_; ++j) {
            sum += A.p[i][j] * x.p[j][0];
        }
        x.p[i][0] = (b.p[i][0] - sum) / A.p[i][i];
        if (x.p[i][0] < EPS && x.p[i][0] > -1*EPS)
            x.p[i][0] = 0;
    }

    return x;
}